

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O0

void __thiscall
pg::RTLSolver::attractTangles(RTLSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G,int maxpr)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  bool bVar2;
  reference piVar3;
  const_iterator cStack_50;
  int from;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_cur;
  bitset *G_local;
  bitset *Z_local;
  bitset *R_local;
  int v_local;
  int pl_local;
  RTLSolver *this_local;
  
  pvVar1 = this->tin;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar1 + v);
  cStack_50 = std::vector<int,_std::allocator<int>_>::end(pvVar1 + v);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb0);
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    attractTangle(this,*piVar3,pl,R,Z,G,maxpr);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void
RTLSolver::attractTangles(int pl, int v, bitset &R, bitset &Z, bitset &G, int maxpr)
{
    const auto &in_cur = tin[v];
    for (int from : in_cur) attractTangle(from, pl, R, Z, G, maxpr);
}